

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.hpp
# Opt level: O0

void __thiscall helics::BrokerKeeper::~BrokerKeeper(BrokerKeeper *this)

{
  milliseconds waitTime;
  bool bVar1;
  BrokerApp *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  int iVar3;
  duration<long,std::ratio<1l,1000l>> local_10 [16];
  
  bVar1 = BrokerApp::isConnected(in_RDI);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe8);
  if (bVar1) {
    iVar3 = 0;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_10,(int *)&stack0xffffffffffffffec);
    waitTime.__r._4_4_ = iVar3;
    waitTime.__r._0_4_ = uVar2;
    BrokerApp::waitForDisconnect(in_RDI,waitTime);
  }
  BrokerApp::~BrokerApp(in_RDI);
  return;
}

Assistant:

~BrokerKeeper()
    {
        if (brk.isConnected()) {
            brk.waitForDisconnect();
        }
    }